

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptFunction.cpp
# Opt level: O0

AsmJsScriptFunction *
Js::AsmJsScriptFunction::OP_NewAsmJsFunc(FrameDisplay *environment,FunctionInfoPtrPtr infoRef)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  FunctionInfo *this;
  FunctionProxy *this_00;
  ScriptContext *this_01;
  JavascriptLibrary *this_02;
  AsmJsScriptFunction *this_03;
  AsmJsScriptFunction *asmJsFunc;
  ScriptContext *scriptContext;
  FunctionProxy *functionProxy;
  FunctionInfoPtrPtr infoRef_local;
  FrameDisplay *environment_local;
  
  if (infoRef == (FunctionInfoPtrPtr)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/ScriptFunction.cpp"
                                ,0x24c,"(infoRef != nullptr)",
                                "BYTE-CODE VERIFY: Must specify a valid function to create");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  this = Memory::WriteBarrierPtr<Js::FunctionInfo>::operator->(infoRef);
  this_00 = FunctionInfo::GetFunctionProxy(this);
  if (this_00 == (FunctionProxy *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/ScriptFunction.cpp"
                                ,0x24e,"(functionProxy != nullptr)",
                                "BYTE-CODE VERIFY: Must specify a valid function to create");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  this_01 = FunctionProxy::GetScriptContext(this_00);
  bVar2 = FunctionProxy::HasSuperReference(this_00);
  if (bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/ScriptFunction.cpp"
                                ,0x252,"(!functionProxy->HasSuperReference())",
                                "!functionProxy->HasSuperReference()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  this_02 = ScriptContext::GetLibrary(this_01);
  this_03 = JavascriptLibrary::CreateAsmJsScriptFunction(this_02,this_00);
  ScriptFunction::SetEnvironment(&this_03->super_ScriptFunction,environment);
  return this_03;
}

Assistant:

AsmJsScriptFunction * AsmJsScriptFunction::OP_NewAsmJsFunc(FrameDisplay *environment, FunctionInfoPtrPtr infoRef)
    {
        AssertMsg(infoRef != nullptr, "BYTE-CODE VERIFY: Must specify a valid function to create");
        FunctionProxy* functionProxy = (*infoRef)->GetFunctionProxy();
        AssertMsg(functionProxy != nullptr, "BYTE-CODE VERIFY: Must specify a valid function to create");

        ScriptContext* scriptContext = functionProxy->GetScriptContext();

        Assert(!functionProxy->HasSuperReference());
        AsmJsScriptFunction* asmJsFunc = scriptContext->GetLibrary()->CreateAsmJsScriptFunction(functionProxy);
        asmJsFunc->SetEnvironment(environment);

        JS_ETW(EventWriteJSCRIPT_RECYCLER_ALLOCATE_FUNCTION(asmJsFunc, EtwTrace::GetFunctionId(functionProxy)));

        return asmJsFunc;
    }